

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O0

void testStartWriteDeepTile(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *this;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  uint32_t verflags;
  exr_result_t _test_rv_3;
  exr_storage_t storage;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  int partidx;
  string outfn;
  exr_context_t outf;
  char *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  uint line;
  char *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_ac;
  undefined8 local_a8;
  code *pcStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_34;
  string local_30 [32];
  undefined8 local_10 [2];
  
  line = (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20);
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_48 = 0;
  local_a8 = 0x68;
  uStack_50 = 0xbf800000fffffffe;
  pcStack_a0 = err_cb;
  uVar2 = std::__cxx11::string::c_str();
  local_ac = exr_start_write(local_10,uVar2,0,&local_a8);
  if (local_ac != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_ac);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_ac);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  local_c0 = exr_add_part(local_10[0],"beauty",3,&local_34);
  if (local_c0 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c0);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c0);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  if (local_34 != 0) {
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  local_c4 = exr_get_count(local_10[0],&local_34);
  if (local_c4 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  if (local_34 != 1) {
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  local_34 = 0;
  local_cc = exr_get_storage(local_10[0],0,&local_c8);
  if (local_cc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_cc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_cc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  if (local_c8 != 3) {
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  iVar1 = exr_get_file_version_and_flags(local_10[0],&local_d0);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  if (local_d0 != 0x802) {
    core_test_fail(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,line,
                   in_stack_fffffffffffffdf8);
  }
  iVar1 = exr_finish(local_10);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    this = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,pcVar4,(uint)((ulong)this >> 0x20),in_stack_fffffffffffffdf8);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  remove(pcVar4);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testStartWriteDeepTile (const std::string& tempdir)
{
    exr_context_t outf;
    std::string   outfn = tempdir + "testattr.exr";
    int           partidx;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));

    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_DEEP_TILED, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    exr_storage_t storage;
    EXRCORE_TEST_RVAL (exr_get_storage (outf, partidx, &storage));
    EXRCORE_TEST (storage == EXR_STORAGE_DEEP_TILED);

    uint32_t verflags;
    EXRCORE_TEST_RVAL (
        exr_get_file_version_and_flags (outf, &verflags));
    EXRCORE_TEST (verflags == (2 | 0x00000800));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
    remove (outfn.c_str ());
}